

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

string * __thiscall
JSON::JSONValue::toString_abi_cxx11_(string *__return_storage_ptr__,JSONValue *this,int indent)

{
  pointer pcVar1;
  string *psVar2;
  JSONObject *this_00;
  JSONArray *arr;
  bool *pbVar3;
  ulong uVar4;
  char *pcVar5;
  double dVar6;
  string toprint;
  stringstream out;
  char local_1d9;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  switch(this->type) {
  case STRING:
    psVar2 = getStringValue_abi_cxx11_(this);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar1,pcVar1 + psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
    if (local_1d8._M_string_length != 0) {
      uVar4 = 0;
      do {
        if (local_1d8._M_dataplus._M_p[uVar4] == '\"') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\\\"",2);
        }
        else {
          local_1d9 = local_1d8._M_dataplus._M_p[uVar4];
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1d9,1);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_1d8._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) break;
    goto LAB_00109eea;
  case INTEGER:
    getIntValue(this);
    std::ostream::_M_insert<long_long>((longlong)local_1a8);
    break;
  case DOUBLE:
    dVar6 = getDoubleValue(this);
    std::ostream::_M_insert<double>(dVar6);
    break;
  case ARRAY:
    arr = getArrayValue(this);
    operator<<(local_1a8,arr);
    break;
  case OBJECT:
    this_00 = getObjectValue(this);
    JSONObject::toString_abi_cxx11_(&local_1d8,this_00,indent + 2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) break;
LAB_00109eea:
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    break;
  case BOOLEAN:
    pbVar3 = getBoolValue(this);
    pcVar5 = "false";
    if ((ulong)*pbVar3 != 0) {
      pcVar5 = "true";
    }
    uVar4 = (ulong)*pbVar3 ^ 5;
    goto LAB_00109f7a;
  case JSONNULL:
    uVar4 = 4;
    pcVar5 = "null";
LAB_00109f7a:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar5,uVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string JSONValue::toString(int indent) const {
	stringstream out;
	switch(getType()) {
		case STRING:
			{
				string toprint=getStringValue();
				out << "\"";
				for(size_t i=0;i<toprint.size();i++)
					if(toprint[i]=='"')
						out << "\\\"";
					else
						out << toprint[i];
				out << "\"";
				break;
			}
		case INTEGER:
			out << getIntValue();
			break;
		case DOUBLE:
			out << getDoubleValue();
			break;
		case ARRAY:
			out << getArrayValue();
			break;
		case OBJECT:
			out << getObjectValue().toString(indent+2);
			break;
		case BOOLEAN:
			if(getBoolValue()==true)
				out << "true";
			else
				out << "false";
			break;
		case JSONNULL:
			out << "null";
			break;
	}
	return out.str();
}